

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O2

void __thiscall
CppUnit::PlugInManager::load
          (PlugInManager *this,string *libraryFileName,PlugInParameters *parameters)

{
  CppUnitTestPlugIn *pCVar1;
  DynamicLibraryManager *this_00;
  code *pcVar2;
  TestFactoryRegistry *pTVar3;
  allocator<char> local_71;
  string local_70;
  PlugInInfo info;
  
  info.m_fileName._M_dataplus._M_p = (pointer)&info.m_fileName.field_2;
  info.m_fileName._M_string_length = 0;
  info.m_fileName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&info);
  this_00 = (DynamicLibraryManager *)operator_new(0x28);
  DynamicLibraryManager::DynamicLibraryManager(this_00,libraryFileName);
  info.m_manager = this_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"cppunitTestPlugIn",&local_71);
  pcVar2 = (code *)DynamicLibraryManager::findSymbol(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  info.m_interface = (CppUnitTestPlugIn *)(*pcVar2)();
  std::
  deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
  push_back(&this->m_plugIns,&info);
  pCVar1 = info.m_interface;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"All Tests",&local_71);
  pTVar3 = TestFactoryRegistry::getRegistry(&local_70);
  (**pCVar1->_vptr_CppUnitTestPlugIn)(pCVar1,pTVar3,parameters);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&info);
  return;
}

Assistant:

void
PlugInManager::load( const std::string &libraryFileName,
                     const PlugInParameters &parameters )
{
  PlugInInfo info;
  info.m_fileName = libraryFileName;
  info.m_manager = new DynamicLibraryManager( libraryFileName );

  TestPlugInSignature plug = (TestPlugInSignature)((uintptr_t)info.m_manager->findSymbol( 
        CPPUNIT_STRINGIZE( CPPUNIT_PLUGIN_EXPORTED_NAME ) ));
  info.m_interface = (*plug)();

  m_plugIns.push_back( info );
  
  info.m_interface->initialize( &TestFactoryRegistry::getRegistry(), parameters );
}